

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O3

void __thiscall Omega_h::MetricEdgeLengths<2,_2>::~MetricEdgeLengths(MetricEdgeLengths<2,_2> *this)

{
  int *piVar1;
  Alloc *pAVar2;
  
  pAVar2 = (this->metrics).write_.shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = (this->coords).write_.shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
      return;
    }
  }
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}